

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall deqp::egl::Image::RenderTests::addRenderActions(RenderTests *this)

{
  LabeledActions *this_00;
  allocator<char> local_69;
  string local_68;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_48;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_38;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_28;
  UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_> local_18;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"texture",&local_69);
  local_18.m_data.ptr = (Action *)operator_new(8);
  this_00 = &this->m_renderActions;
  (local_18.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_003de1e0;
  LabeledActions::add(this_00,&local_68,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_18);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_18);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"read_pixels",&local_69);
  local_28.m_data.ptr = (Action *)operator_new(8);
  (local_28.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_003de288;
  LabeledActions::add(this_00,&local_68,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_28);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"depth_buffer",&local_69);
  local_38.m_data.ptr = (Action *)operator_new(8);
  (local_38.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_003de218;
  LabeledActions::add(this_00,&local_68,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_38);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_38);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"stencil_buffer",&local_69)
  ;
  local_48.m_data.ptr = (Action *)operator_new(8);
  (local_48.m_data.ptr)->_vptr_Action = (_func_int **)&PTR__Action_003de250;
  LabeledActions::add(this_00,&local_68,
                      (MovePtr<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>
                       *)&local_48);
  de::details::UniqueBase<deqp::egl::Image::Action,_de::DefaultDeleter<deqp::egl::Image::Action>_>::
  ~UniqueBase(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void RenderTests::addRenderActions (void)
{
	m_renderActions.add("texture",			MovePtr<Action>(new GLES2ImageApi::RenderTexture2D()));
	m_renderActions.add("read_pixels",		MovePtr<Action>(new GLES2ImageApi::RenderReadPixelsRenderbuffer()));
	m_renderActions.add("depth_buffer",		MovePtr<Action>(new GLES2ImageApi::RenderDepthbuffer()));
	m_renderActions.add("stencil_buffer",	MovePtr<Action>(new GLES2ImageApi::RenderStencilbuffer()));
}